

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::WriteDeviceLinkRule
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *output)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  cmMakefile *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  string_view arg;
  pointer pbVar2;
  undefined8 target;
  bool bVar3;
  TargetType targetType;
  string *psVar4;
  reference pbVar5;
  type pcVar6;
  cmGeneratorTarget *pcVar7;
  pointer pcVar8;
  iterator __first;
  iterator __last;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c60;
  cmOutputConverter *local_c28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_bb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b48;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_aa1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a98;
  iterator local_a78;
  size_type local_a70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a68;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_> local_a50;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string local_a40;
  undefined1 local_a20 [8];
  string compileCmd;
  string local_9e0;
  allocator<char> local_9b9;
  string local_9b8;
  undefined1 local_998 [8];
  string flags;
  string local_970;
  undefined1 local_950 [8];
  string linkFlags;
  RuleVariables vars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  iterator local_7b0;
  size_type local_7a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_7a0;
  cmAlphaNum local_788;
  cmAlphaNum local_758;
  undefined1 local_728 [8];
  string fatbinaryOutputRel;
  cmAlphaNum local_6d8;
  undefined1 local_6a8 [8];
  string fatbinaryOutput;
  allocator<char> local_651;
  string local_650;
  cmAlphaNum local_630;
  undefined1 local_600 [8];
  string fatbinaryCommand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  iterator local_5b0;
  size_type local_5a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5a0;
  string_view local_588;
  string_view local_578;
  string local_568;
  cmAlphaNum local_548;
  allocator<char> local_511;
  string local_510;
  cmAlphaNum local_4f0;
  undefined1 local_4c0 [8];
  string command;
  cmAlphaNum local_470;
  string local_440;
  cmAlphaNum local_420;
  cmAlphaNum local_3f0;
  undefined1 local_3c0 [8];
  string cubin;
  string architecture;
  cmAlphaNum local_350;
  string local_320;
  cmAlphaNum local_300;
  cmAlphaNum local_2d0;
  undefined1 local_2a0 [8];
  string registerFileRel;
  string registerFileCmd;
  string *architectureKind;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmAlphaNum local_210;
  undefined1 local_1e0 [8];
  string registerFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fatbinaryDepends;
  string profiles;
  undefined1 local_168 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cleanFiles;
  string relObjectDir;
  string objectDir;
  undefined1 local_100 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkDeps;
  string *relPath;
  undefined1 local_d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  cmLocalUnixMakefileGenerator3 *localGen;
  string local_a8;
  string_view local_88;
  allocator<char> local_61;
  string local_60;
  string local_40 [8];
  string architecturesStr;
  string *output_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  cmMakefileTargetGenerator *this_local;
  
  pcVar7 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  architecturesStr.field_2._8_8_ = output;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CUDA_ARCHITECTURES",&local_61);
  psVar4 = cmGeneratorTarget::GetSafeProperty(pcVar7,&local_60);
  std::__cxx11::string::string(local_40,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  local_88 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
  bVar3 = cmIsOff(local_88);
  if (bVar3) {
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,
               "CUDA_SEPARABLE_COMPILATION on Clang requires CUDA_ARCHITECTURES to be set.",
               (allocator<char> *)((long)&localGen + 7));
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&localGen + 7));
    localGen._0_4_ = 1;
  }
  else {
    architectures.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this->LocalGenerator;
    arg = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d0,arg,false);
    linkDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         cmLocalUnixMakefileGenerator3::GetHomeRelativeOutputPath_abi_cxx11_
                   ((cmLocalUnixMakefileGenerator3 *)
                    architectures.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    objectDir.field_2._8_8_ = this;
    WriteDeviceLinkRule(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&)
    ::$_0::operator()[abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_100,(void *)((long)&objectDir.field_2 + 8));
    std::__cxx11::string::string
              ((string *)(relObjectDir.field_2._M_local_buf + 8),
               (string *)&((this->super_cmCommonTargetGenerator).GeneratorTarget)->ObjectDirectory);
    cmOutputConverter::MaybeRelativeToCurBinDir
              ((string *)
               &cleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (cmOutputConverter *)
               &(architectures.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_string_length,
               (string *)((long)&relObjectDir.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_168);
    cmOutputConverter::MaybeRelativeToCurBinDir
              ((string *)((long)&profiles.field_2 + 8),
               (cmOutputConverter *)
               &(architectures.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_string_length,
               (string *)architecturesStr.field_2._8_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_168,(value_type *)((long)&profiles.field_2 + 8));
    std::__cxx11::string::~string((string *)(profiles.field_2._M_local_buf + 8));
    std::__cxx11::string::string
              ((string *)
               &fatbinaryDepends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&registerFile.field_2 + 8));
    cmAlphaNum::cmAlphaNum(&local_210,(string *)((long)&relObjectDir.field_2 + 8));
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&__range1,"cmake_cuda_register.h");
    cmStrCat<>((string *)local_1e0,&local_210,(cmAlphaNum *)&__range1);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_d0);
    architectureKind =
         (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d0);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&architectureKind);
      if (!bVar3) break;
      pbVar5 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      std::__cxx11::string::string((string *)(registerFileRel.field_2._M_local_buf + 8));
      bVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&registerFile.field_2 + 8));
      if (bVar3) {
        cmAlphaNum::cmAlphaNum
                  (&local_2d0,
                   linkDeps.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmAlphaNum::cmAlphaNum
                  (&local_300,
                   (string *)
                   &cleanFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmStrCat<char[22]>((string *)local_2a0,&local_2d0,&local_300,(char (*) [22])0xbe16b5);
        cmAlphaNum::cmAlphaNum(&local_350," --register-link-binaries=");
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&architecture.field_2 + 8),(string *)local_2a0);
        cmStrCat<>(&local_320,&local_350,(cmAlphaNum *)((long)&architecture.field_2 + 8));
        std::__cxx11::string::operator=
                  ((string *)(registerFileRel.field_2._M_local_buf + 8),(string *)&local_320);
        std::__cxx11::string::~string((string *)&local_320);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_168,(value_type *)local_2a0);
        std::__cxx11::string::~string((string *)local_2a0);
      }
      std::__cxx11::string::find((char)pbVar5,0x2d);
      std::__cxx11::string::substr((ulong)((long)&cubin.field_2 + 8),(ulong)pbVar5);
      cmAlphaNum::cmAlphaNum(&local_3f0,(string *)((long)&relObjectDir.field_2 + 8));
      cmAlphaNum::cmAlphaNum(&local_420,"sm_");
      cmStrCat<std::__cxx11::string,char[7]>
                ((string *)local_3c0,&local_3f0,&local_420,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&cubin.field_2 + 8),(char (*) [7])".cubin");
      cmAlphaNum::cmAlphaNum(&local_470," -im=profile=sm_");
      cmAlphaNum::cmAlphaNum
                ((cmAlphaNum *)((long)&command.field_2 + 8),(string *)((long)&cubin.field_2 + 8));
      cmStrCat<char[7],std::__cxx11::string>
                (&local_440,&local_470,(cmAlphaNum *)((long)&command.field_2 + 8),
                 (char (*) [7])",file=",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
      std::__cxx11::string::operator+=
                ((string *)
                 &fatbinaryDepends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_440);
      std::__cxx11::string::~string((string *)&local_440);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 (registerFile.field_2._M_local_buf + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
      pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"CMAKE_CUDA_DEVICE_LINKER",&local_511);
      psVar4 = cmMakefile::GetRequiredDefinition(pcVar1,&local_510);
      cmAlphaNum::cmAlphaNum(&local_4f0,psVar4);
      cmAlphaNum::cmAlphaNum(&local_548," -arch=sm_");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_578," ");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_588);
      cmJoin(&local_568,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_100,local_578,local_588);
      cmStrCat<std::__cxx11::string,std::__cxx11::string,char[8],std::__cxx11::string>
                ((string *)local_4c0,&local_4f0,&local_548,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&cubin.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&registerFileRel.field_2 + 8),(char (*) [8])" -o=$@ ",&local_568);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::~string((string *)&local_510);
      std::allocator<char>::~allocator(&local_511);
      pbVar2 = architectures.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pcVar6 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
               operator*(&this->BuildFileStream);
      std::__cxx11::string::string((string *)&local_5d0,(string *)local_4c0);
      local_5b0 = &local_5d0;
      local_5a8 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(fatbinaryCommand.field_2._M_local_buf + 0xf));
      __l_01._M_len = local_5a8;
      __l_01._M_array = local_5b0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_5a0,__l_01,
               (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(fatbinaryCommand.field_2._M_local_buf + 0xf));
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                ((cmLocalUnixMakefileGenerator3 *)pbVar2,(ostream *)pcVar6,(char *)0x0,
                 (string *)local_3c0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_100,&local_5a0,false,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_5a0);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(fatbinaryCommand.field_2._M_local_buf + 0xf));
      local_b48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5b0;
      do {
        local_b48 = local_b48 + -1;
        std::__cxx11::string::~string((string *)local_b48);
      } while (local_b48 != &local_5d0);
      std::__cxx11::string::~string((string *)local_4c0);
      std::__cxx11::string::~string((string *)local_3c0);
      std::__cxx11::string::~string((string *)(cubin.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(registerFileRel.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_650,"CMAKE_CUDA_FATBINARY",&local_651);
    psVar4 = cmMakefile::GetRequiredDefinition(pcVar1,&local_650);
    cmAlphaNum::cmAlphaNum(&local_630,psVar4);
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)((long)&fatbinaryOutput.field_2 + 8),
               " -64 -cmdline=--compile-only -compress-all -link --embedded-fatbin=$@");
    cmStrCat<std::__cxx11::string>
              ((string *)local_600,&local_630,(cmAlphaNum *)((long)&fatbinaryOutput.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &fatbinaryDepends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_650);
    std::allocator<char>::~allocator(&local_651);
    cmAlphaNum::cmAlphaNum(&local_6d8,(string *)((long)&relObjectDir.field_2 + 8));
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)((long)&fatbinaryOutputRel.field_2 + 8),"cmake_cuda_fatbin.h");
    cmStrCat<>((string *)local_6a8,&local_6d8,(cmAlphaNum *)((long)&fatbinaryOutputRel.field_2 + 8))
    ;
    cmAlphaNum::cmAlphaNum
              (&local_758,
               linkDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmAlphaNum::cmAlphaNum
              (&local_788,
               (string *)
               &cleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmStrCat<char[20]>((string *)local_728,&local_758,&local_788,(char (*) [20])0xbe16e4);
    pbVar2 = architectures.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar6 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->BuildFileStream);
    std::__cxx11::string::string((string *)&local_7d0,(string *)local_600);
    local_7b0 = &local_7d0;
    local_7a8 = 1;
    this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&vars.Launcher + 7);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(this_00);
    __l_00._M_len = local_7a8;
    __l_00._M_array = local_7b0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_7a0,__l_00,this_00);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              ((cmLocalUnixMakefileGenerator3 *)pbVar2,(ostream *)pcVar6,(char *)0x0,
               (string *)local_728,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&registerFile.field_2 + 8),&local_7a0,false,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_7a0);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&vars.Launcher + 7));
    local_bb8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_7b0;
    do {
      local_bb8 = local_bb8 + -1;
      std::__cxx11::string::~string((string *)local_bb8);
    } while (local_bb8 != &local_7d0);
    cmRulePlaceholderExpander::RuleVariables::RuleVariables
              ((RuleVariables *)((long)&linkFlags.field_2 + 8));
    pcVar7 = GetGeneratorTarget(this);
    cmGeneratorTarget::GetName_abi_cxx11_(pcVar7);
    linkFlags.field_2._8_8_ = std::__cxx11::string::c_str();
    pcVar7 = GetGeneratorTarget(this);
    targetType = cmGeneratorTarget::GetType(pcVar7);
    cmState::GetTargetTypeName_abi_cxx11_(targetType);
    vars.CMTargetName = (char *)std::__cxx11::string::c_str();
    vars.TargetVersionMinor = "CUDA";
    vars.Output = (char *)std::__cxx11::string::c_str();
    vars.CudaCompileMode = (char *)std::__cxx11::string::c_str();
    vars.Fatbinary = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)local_950);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_970,"CUDA",(allocator<char> *)(flags.field_2._M_local_buf + 0xf));
    GetDeviceLinkFlags(this,(string *)local_950,&local_970);
    std::__cxx11::string::~string((string *)&local_970);
    std::allocator<char>::~allocator((allocator<char> *)(flags.field_2._M_local_buf + 0xf));
    vars.TargetInstallNameDir = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b8,"CUDA",&local_9b9);
    GetConfigName_abi_cxx11_(&local_9e0,this);
    std::__cxx11::string::string((string *)(compileCmd.field_2._M_local_buf + 8));
    cmCommonTargetGenerator::GetFlags
              ((string *)local_998,&this->super_cmCommonTargetGenerator,&local_9b8,&local_9e0,
               (string *)(compileCmd.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(compileCmd.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_9e0);
    std::__cxx11::string::~string((string *)&local_9b8);
    std::allocator<char>::~allocator(&local_9b9);
    vars.ObjectFileDir = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a40,"CMAKE_CUDA_DEVICE_LINK_COMPILE",
               (allocator<char> *)
               ((long)&rulePlaceholderExpander._M_t.
                       super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                       .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7))
    ;
    GetLinkRule((string *)local_a20,this,&local_a40);
    std::__cxx11::string::~string((string *)&local_a40);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&rulePlaceholderExpander._M_t.
                       super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                       .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7))
    ;
    pcVar8 = (pointer)(**(code **)(*(long *)architectures.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                  0x28))();
    std::unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>::
    unique_ptr<std::default_delete<cmRulePlaceholderExpander>,void>
              ((unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>
                *)&local_a50,pcVar8);
    pcVar8 = std::
             unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
             ::operator->(&local_a50);
    local_c28 = (cmOutputConverter *)0x0;
    if (architectures.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      local_c28 = (cmOutputConverter *)
                  &(architectures.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_string_length;
    }
    cmRulePlaceholderExpander::ExpandRuleVariables
              (pcVar8,local_c28,(string *)local_a20,(RuleVariables *)((long)&linkFlags.field_2 + 8))
    ;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a20);
    pbVar2 = architectures.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar6 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->BuildFileStream);
    target = architecturesStr.field_2._8_8_;
    local_aa0 = &local_a98;
    std::__cxx11::string::string((string *)local_aa0,(string *)local_728);
    local_a78 = &local_a98;
    local_a70 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_aa1);
    __l._M_len = local_a70;
    __l._M_array = local_a78;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_a68,__l,&local_aa1);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              ((cmLocalUnixMakefileGenerator3 *)pbVar2,(ostream *)pcVar6,(char *)0x0,
               (string *)target,&local_a68,commands,false,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a68);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_aa1);
    local_c60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a78;
    do {
      local_c60 = local_c60 + -1;
      std::__cxx11::string::~string((string *)local_c60);
    } while (local_c60 != &local_a98);
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_168);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_168);
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->CleanFiles,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__last._M_current);
    std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
    ~unique_ptr(&local_a50);
    std::__cxx11::string::~string((string *)local_a20);
    std::__cxx11::string::~string((string *)local_998);
    std::__cxx11::string::~string((string *)local_950);
    std::__cxx11::string::~string((string *)local_728);
    std::__cxx11::string::~string((string *)local_6a8);
    std::__cxx11::string::~string((string *)local_600);
    std::__cxx11::string::~string((string *)local_1e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&registerFile.field_2 + 8));
    std::__cxx11::string::~string
              ((string *)
               &fatbinaryDepends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_168);
    std::__cxx11::string::~string
              ((string *)
               &cleanFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)(relObjectDir.field_2._M_local_buf + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_100);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d0);
    localGen._0_4_ = 0;
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteDeviceLinkRule(
  std::vector<std::string>& commands, const std::string& output)
{
  std::string architecturesStr =
    this->GeneratorTarget->GetSafeProperty("CUDA_ARCHITECTURES");

  if (cmIsOff(architecturesStr)) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 "CUDA_SEPARABLE_COMPILATION on Clang "
                                 "requires CUDA_ARCHITECTURES to be set.");
    return;
  }

  cmLocalUnixMakefileGenerator3* localGen{ this->LocalGenerator };
  std::vector<std::string> architectures = cmExpandedList(architecturesStr);
  std::string const& relPath = localGen->GetHomeRelativeOutputPath();

  // Ensure there are no duplicates.
  const std::vector<std::string> linkDeps = [&]() -> std::vector<std::string> {
    std::vector<std::string> deps;
    this->AppendTargetDepends(deps, true);
    this->GeneratorTarget->GetLinkDepends(deps, this->GetConfigName(), "CUDA");

    for (std::string const& obj : this->Objects) {
      deps.emplace_back(cmStrCat(relPath, obj));
    }

    std::unordered_set<std::string> depsSet(deps.begin(), deps.end());
    deps.clear();
    std::copy(depsSet.begin(), depsSet.end(), std::back_inserter(deps));
    return deps;
  }();

  const std::string objectDir = this->GeneratorTarget->ObjectDirectory;
  const std::string relObjectDir =
    localGen->MaybeRelativeToCurBinDir(objectDir);

  // Construct a list of files associated with this executable that
  // may need to be cleaned.
  std::vector<std::string> cleanFiles;
  cleanFiles.push_back(localGen->MaybeRelativeToCurBinDir(output));

  std::string profiles;
  std::vector<std::string> fatbinaryDepends;
  std::string const registerFile =
    cmStrCat(objectDir, "cmake_cuda_register.h");

  // Link device code for each architecture.
  for (const std::string& architectureKind : architectures) {
    std::string registerFileCmd;

    // The generated register file contains macros that when expanded
    // register the device routines. Because the routines are the same for
    // all architectures the register file will be the same too. Thus
    // generate it only on the first invocation to reduce overhead.
    if (fatbinaryDepends.empty()) {
      std::string const registerFileRel =
        cmStrCat(relPath, relObjectDir, "cmake_cuda_register.h");
      registerFileCmd =
        cmStrCat(" --register-link-binaries=", registerFileRel);
      cleanFiles.push_back(registerFileRel);
    }

    // Clang always generates real code, so strip the specifier.
    const std::string architecture =
      architectureKind.substr(0, architectureKind.find('-'));
    const std::string cubin =
      cmStrCat(objectDir, "sm_", architecture, ".cubin");

    profiles += cmStrCat(" -im=profile=sm_", architecture, ",file=", cubin);
    fatbinaryDepends.emplace_back(cubin);

    std::string command = cmStrCat(
      this->Makefile->GetRequiredDefinition("CMAKE_CUDA_DEVICE_LINKER"),
      " -arch=sm_", architecture, registerFileCmd, " -o=$@ ",
      cmJoin(linkDeps, " "));

    localGen->WriteMakeRule(*this->BuildFileStream, nullptr, cubin, linkDeps,
                            { command }, false);
  }

  // Combine all architectures into a single fatbinary.
  const std::string fatbinaryCommand =
    cmStrCat(this->Makefile->GetRequiredDefinition("CMAKE_CUDA_FATBINARY"),
             " -64 -cmdline=--compile-only -compress-all -link "
             "--embedded-fatbin=$@",
             profiles);
  const std::string fatbinaryOutput =
    cmStrCat(objectDir, "cmake_cuda_fatbin.h");
  const std::string fatbinaryOutputRel =
    cmStrCat(relPath, relObjectDir, "cmake_cuda_fatbin.h");

  localGen->WriteMakeRule(*this->BuildFileStream, nullptr, fatbinaryOutputRel,
                          fatbinaryDepends, { fatbinaryCommand }, false);

  // Compile the stub that registers the kernels and contains the
  // fatbinaries.
  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()).c_str();

  vars.Language = "CUDA";
  vars.Object = output.c_str();
  vars.Fatbinary = fatbinaryOutput.c_str();
  vars.RegisterFile = registerFile.c_str();

  std::string linkFlags;
  this->GetDeviceLinkFlags(linkFlags, "CUDA");
  vars.LinkFlags = linkFlags.c_str();

  std::string flags = this->GetFlags("CUDA", this->GetConfigName());
  vars.Flags = flags.c_str();

  std::string compileCmd = this->GetLinkRule("CMAKE_CUDA_DEVICE_LINK_COMPILE");
  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    localGen->CreateRulePlaceholderExpander());
  rulePlaceholderExpander->ExpandRuleVariables(localGen, compileCmd, vars);

  commands.emplace_back(compileCmd);
  localGen->WriteMakeRule(*this->BuildFileStream, nullptr, output,
                          { fatbinaryOutputRel }, commands, false);

  // Clean all the possible executable names and symlinks.
  this->CleanFiles.insert(cleanFiles.begin(), cleanFiles.end());
}